

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

DeepFrameBuffer * __thiscall Imf_3_2::DeepTiledOutputFile::frameBuffer(DeepTiledOutputFile *this)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  pDVar1 = this->_data;
  pthread_mutex_unlock(__mutex);
  return &pDVar1->frameBuffer;
}

Assistant:

const DeepFrameBuffer&
DeepTiledOutputFile::frameBuffer () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    return _data->frameBuffer;
}